

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

XMLElement * CGL::Collada::ColladaParser::get_technique_CGL(XMLElement *xml)

{
  XMLElement *pXVar1;
  int iVar2;
  XMLElement *this;
  char *pcVar3;
  string profile;
  allocator local_79;
  XMLElement *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"extra/technique","");
  this = get_element(xml,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  do {
    if (this == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    pcVar3 = tinyxml2::XMLElement::Attribute(this,"profile",(char *)0x0);
    std::__cxx11::string::string((string *)local_70,pcVar3,&local_79);
    iVar2 = std::__cxx11::string::compare((char *)local_70);
    pXVar1 = this;
    if (iVar2 != 0) {
      this = tinyxml2::XMLNode::NextSiblingElement(&this->super_XMLNode,"technique");
      pXVar1 = local_78;
    }
    local_78 = pXVar1;
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
  } while (iVar2 != 0);
  return local_78;
}

Assistant:

XMLElement* ColladaParser::get_technique_CGL( XMLElement* xml ) {

  XMLElement* technique = get_element(xml, "extra/technique");
  while (technique) {
    string profile = technique->Attribute("profile");
    if (profile == "CGL") return technique;
    technique = technique->NextSiblingElement("technique");
  }

  return NULL;

}